

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glProgramReady(void)

{
  GLfloat *pGVar1;
  size_t sVar2;
  MOJOSHADER_shaderType MVar3;
  MOJOSHADER_uniformType MVar4;
  int iVar5;
  uint uVar6;
  MOJOSHADER_glProgram *pMVar7;
  MOJOSHADER_uniform *pMVar8;
  MOJOSHADER_parseData *pMVar9;
  MOJOSHADER_sampler *pMVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  GLfloat *pGVar15;
  long lVar16;
  GLint *__s1;
  uint32 uVar17;
  MOJOSHADER_glContext *pMVar18;
  uint8 *puVar19;
  ulong uVar20;
  MOJOSHADER_shaderType MVar21;
  GLint *pGVar22;
  uint uVar23;
  GLint *local_40;
  GLfloat *local_38;
  
  pMVar7 = ctx->bound_program;
  if (pMVar7 != (MOJOSHADER_glProgram *)0x0) {
    update_enabled_arrays();
    pMVar18 = ctx;
    if (pMVar7->uses_pointsize != ctx->pointsize_enabled) {
      (**(code **)(ctx->profile + (ulong)(pMVar7->uses_pointsize == 0) * 8 + 0x78))(0x8642);
      pMVar18 = ctx;
      ctx->pointsize_enabled = pMVar7->uses_pointsize;
    }
    uVar17 = pMVar7->uniform_count;
    if (((uVar17 != 0) || (pMVar7->texbem_count != 0)) &&
       (pMVar7->generation != pMVar18->generation)) {
      local_38 = pMVar18->vs_reg_file_f;
      local_40 = pMVar18->vs_reg_file_i;
      puVar19 = pMVar18->vs_reg_file_b;
      pGVar15 = pMVar7->vs_uniforms_float4;
      __s1 = pMVar7->vs_uniforms_int4;
      pGVar22 = pMVar7->vs_uniforms_bool;
      MVar21 = MOJOSHADER_TYPE_VERTEX;
      bVar12 = false;
      for (uVar23 = 0; pMVar18 = ctx, uVar23 != uVar17; uVar23 = uVar23 + 1) {
        pMVar8 = pMVar7->uniforms[uVar23].uniform;
        iVar13 = pMVar8->array_count + (uint)(pMVar8->array_count == 0);
        if (pMVar8->constant != 0) {
          __assert_fail("!u->constant",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x983,"void MOJOSHADER_glProgramReady(void)");
        }
        MVar3 = pMVar7->uniforms[uVar23].shader_type;
        MVar4 = pMVar8->type;
        iVar5 = pMVar8->index;
        if (MVar21 != MVar3) {
          if (MVar3 != MOJOSHADER_TYPE_PIXEL) {
            __assert_fail("0 && \"Unexpected shader type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x997,"void MOJOSHADER_glProgramReady(void)");
          }
          if (MVar21 != MOJOSHADER_TYPE_VERTEX) {
            __assert_fail("shader_type == MOJOSHADER_TYPE_VERTEX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x98c,"void MOJOSHADER_glProgramReady(void)");
          }
          local_38 = ctx->ps_reg_file_f;
          local_40 = ctx->ps_reg_file_i;
          puVar19 = ctx->ps_reg_file_b;
          pGVar15 = pMVar7->ps_uniforms_float4;
          __s1 = pMVar7->ps_uniforms_int4;
          pGVar22 = pMVar7->ps_uniforms_bool;
          MVar21 = MOJOSHADER_TYPE_PIXEL;
        }
        if (MVar4 == MOJOSHADER_UNIFORM_BOOL) {
          for (lVar16 = 0; iVar13 != lVar16; lVar16 = lVar16 + 1) {
            if (pGVar22[lVar16] != (uint)puVar19[lVar16 + iVar5]) {
              pGVar22[lVar16] = (uint)puVar19[lVar16 + iVar5];
              bVar12 = true;
            }
          }
          pGVar22 = pGVar22 + iVar13;
        }
        else if (MVar4 == MOJOSHADER_UNIFORM_INT) {
          sVar2 = (long)(iVar13 * 4) * 4;
          iVar14 = bcmp(__s1,local_40 + (iVar5 << 2),sVar2);
          if (iVar14 != 0) {
            memcpy(__s1,local_40 + (iVar5 << 2),sVar2);
            bVar12 = true;
          }
          __s1 = __s1 + iVar13 * 4;
        }
        else if (MVar4 == MOJOSHADER_UNIFORM_FLOAT) {
          sVar2 = (long)(iVar13 * 4) * 4;
          iVar14 = bcmp(pGVar15,local_38 + (long)iVar5 * 4,sVar2);
          if (iVar14 != 0) {
            memcpy(pGVar15,local_38 + (long)iVar5 * 4,sVar2);
            bVar12 = true;
          }
          pGVar15 = pGVar15 + iVar13 * 4;
        }
      }
      uVar23 = pMVar7->texbem_count;
      if ((ulong)uVar23 != 0) {
        if (pMVar7->fragment == (MOJOSHADER_glShader *)0x0) {
          __assert_fail("(!program->texbem_count) || (program->fragment)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x9c4,"void MOJOSHADER_glProgramReady(void)");
        }
        if (3 < uVar23) {
          __assert_fail("program->texbem_count <= MAX_TEXBEMS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x9d0,"void MOJOSHADER_glProgramReady(void)");
        }
        pMVar9 = pMVar7->fragment->parseData;
        pGVar15 = pMVar7->ps_uniforms_float4 +
                  pMVar7->ps_uniforms_float4_count * 4 + (ulong)uVar23 * -8;
        pMVar10 = pMVar9->samplers;
        uVar23 = pMVar9->sampler_count;
        uVar17 = 0;
        for (lVar16 = 0; (ulong)uVar23 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18) {
          if (*(int *)((long)&pMVar10->texbem + lVar16) != 0) {
            uVar6 = *(uint *)((long)&pMVar10->index + lVar16);
            if ((int)uVar6 < 1) {
              __assert_fail("samps[i].index > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d5,"void MOJOSHADER_glProgramReady(void)");
            }
            if (3 < uVar6) {
              __assert_fail("samps[i].index <= MAX_TEXBEMS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d6,"void MOJOSHADER_glProgramReady(void)");
            }
            uVar20 = (ulong)(uVar6 * 6 - 6);
            *(undefined8 *)(pGVar15 + 4) = *(undefined8 *)(pMVar18->texbem_state + uVar20 + 4);
            pGVar1 = pMVar18->texbem_state + uVar20;
            uVar11 = *(undefined8 *)(pGVar1 + 2);
            *(undefined8 *)pGVar15 = *(undefined8 *)pGVar1;
            *(undefined8 *)(pGVar15 + 2) = uVar11;
            pGVar15[6] = 0.0;
            pGVar15[7] = 0.0;
            pGVar15 = pGVar15 + 8;
            uVar17 = uVar17 + 1;
          }
        }
        if (uVar17 != pMVar7->texbem_count) {
          __assert_fail("texbem_count == program->texbem_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x9e0,"void MOJOSHADER_glProgramReady(void)");
        }
      }
      pMVar18 = ctx;
      pMVar7->generation = ctx->generation;
      if (bVar12) {
        (*pMVar18->profilePushUniforms)();
        return;
      }
    }
  }
  return;
}

Assistant:

void MOJOSHADER_glProgramReady(void)
{
    MOJOSHADER_glProgram *program = ctx->bound_program;

    if (program == NULL)
        return;  // nothing to do.

    // Toggle vertex attribute arrays on/off, based on our needs.
    update_enabled_arrays();

    if (program->uses_pointsize != ctx->pointsize_enabled)
    {
        if (program->uses_pointsize)
            ctx->glEnable(GL_PROGRAM_POINT_SIZE);
        else
            ctx->glDisable(GL_PROGRAM_POINT_SIZE);
        ctx->pointsize_enabled = program->uses_pointsize;
    } // if

    // push Uniforms to the program from our register files...
    if ( ((program->uniform_count) || (program->texbem_count)) &&
         (program->generation != ctx->generation))
    {
        // vertex shader uniforms come first in program->uniforms array.
        const uint32 count = program->uniform_count;
        const GLfloat *srcf = ctx->vs_reg_file_f;
        const GLint *srci = ctx->vs_reg_file_i;
        const uint8 *srcb = ctx->vs_reg_file_b;
        MOJOSHADER_shaderType shader_type = MOJOSHADER_TYPE_VERTEX;
        GLfloat *dstf = program->vs_uniforms_float4;
        GLint *dsti = program->vs_uniforms_int4;
        GLint *dstb = program->vs_uniforms_bool;
        uint8 uniforms_changed = 0;
        uint32 i;

        for (i = 0; i < count; i++)
        {
            UniformMap *map = &program->uniforms[i];
            const MOJOSHADER_shaderType uniform_shader_type = map->shader_type;
            const MOJOSHADER_uniform *u = map->uniform;
            const MOJOSHADER_uniformType type = u->type;
            const int index = u->index;
            const int size = u->array_count ? u->array_count : 1;

            assert(!u->constant);

            // Did we switch from vertex to pixel (to geometry, etc)?
            if (shader_type != uniform_shader_type)
            {
                // we start with vertex, move to pixel, then to geometry, etc.
                //  The array should always be sorted as such.
                if (uniform_shader_type == MOJOSHADER_TYPE_PIXEL)
                {
                    assert(shader_type == MOJOSHADER_TYPE_VERTEX);
                    srcf = ctx->ps_reg_file_f;
                    srci = ctx->ps_reg_file_i;
                    srcb = ctx->ps_reg_file_b;
                    dstf = program->ps_uniforms_float4;
                    dsti = program->ps_uniforms_int4;
                    dstb = program->ps_uniforms_bool;
                } // if
                else
                {
                    // Should be ordered vertex, then pixel, then geometry.
                    assert(0 && "Unexpected shader type");
                } // else

                shader_type = uniform_shader_type;
            } // if

            if (type == MOJOSHADER_UNIFORM_FLOAT)
            {
                const size_t count = 4 * size;
                const GLfloat *f = &srcf[index * 4];
                if (memcmp(dstf, f, sizeof (GLfloat) * count) != 0)
                {
                    memcpy(dstf, f, sizeof (GLfloat) * count);
                    uniforms_changed = 1;
                }
                dstf += count;
            } // if
            else if (type == MOJOSHADER_UNIFORM_INT)
            {
                const size_t count = 4 * size;
                const GLint *i = &srci[index * 4];
                if (memcmp(dsti, i, sizeof (GLint) * count) != 0)
                {
                    memcpy(dsti, i, sizeof (GLint) * count);
                    uniforms_changed = 1;
                } // if
                dsti += count;
            } // else if
            else if (type == MOJOSHADER_UNIFORM_BOOL)
            {
                const size_t count = size;
                const uint8 *b = &srcb[index];
                size_t i;
                for (i = 0; i < count; i++)
                    if (dstb[i] != b[i])
                    {
                        dstb[i] = (GLint) b[i];
                        uniforms_changed = 1;
                    } // if
                dstb += count;
            } // else if

            // !!! FIXME: set constants that overlap the array.
        } // for

        assert((!program->texbem_count) || (program->fragment));
        if ((program->texbem_count) && (program->fragment))
        {
            const MOJOSHADER_parseData *pd = program->fragment->parseData;
            const int samp_count = pd->sampler_count;
            const MOJOSHADER_sampler *samps = pd->samplers;
            GLfloat *dstf = program->ps_uniforms_float4;
            int texbem_count = 0;

            dstf += (program->ps_uniforms_float4_count * 4) -
                     (program->texbem_count * 8);

            assert(program->texbem_count <= MAX_TEXBEMS);
            for (i = 0; i < samp_count; i++)
            {
                if (samps[i].texbem)
                {
                    assert(samps[i].index > 0);
                    assert(samps[i].index <= MAX_TEXBEMS);
                    memcpy(dstf, &ctx->texbem_state[6 * (samps[i].index-1)],
                           sizeof (GLfloat) * 6);
                    dstf[6] = 0.0f;
                    dstf[7] = 0.0f;
                    dstf += 8;
                    texbem_count++;
                } // if
            } // for

            assert(texbem_count == program->texbem_count);
        } // if

        program->generation = ctx->generation;

        if (uniforms_changed)
            ctx->profilePushUniforms();
    } // if
}